

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O1

void __thiscall QAbstractProxyModel::QAbstractProxyModel(QAbstractProxyModel *this,QObject *parent)

{
  QObject **ppQVar1;
  QAbstractItemModelPrivate *this_00;
  QAbstractItemModel *pQVar2;
  
  this_00 = (QAbstractItemModelPrivate *)operator_new(0xe8);
  QAbstractItemModelPrivate::QAbstractItemModelPrivate(this_00);
  (this_00->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QAbstractItemModelPrivate_006b2c08;
  this_00[1].super_QObjectPrivate.super_QObjectData._vptr_QObjectData = (_func_int **)0x0;
  ppQVar1 = &this_00[1].super_QObjectPrivate.super_QObjectData.q_ptr;
  *(byte *)ppQVar1 = *(byte *)ppQVar1 & 0xf0;
  QAbstractItemModel::QAbstractItemModel((QAbstractItemModel *)this,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_006b2880;
  pQVar2 = QAbstractItemModelPrivate::staticEmptyModel();
  (**(code **)(*(long *)this + 0x188))(this,pQVar2);
  return;
}

Assistant:

QAbstractProxyModel::QAbstractProxyModel(QObject *parent)
    :QAbstractItemModel(*new QAbstractProxyModelPrivate, parent)
{
    setSourceModel(QAbstractItemModelPrivate::staticEmptyModel());
}